

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::CanGetAddresses(CWallet *this,bool internal)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long *plVar3;
  char cVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *spk_managers;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *pmVar8;
  long lVar9;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  if ((this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pmVar8 = &this->m_internal_spk_managers;
    if (!internal) {
      pmVar8 = &this->m_external_spk_managers;
    }
    p_Var1 = &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
    lVar9 = 0;
    do {
      p_Var6 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var6 != (_Base_ptr)0x0) {
        iVar2 = *(int *)((long)OUTPUT_TYPES._M_elems + lVar9);
        p_Var5 = &p_Var1->_M_header;
        do {
          if (iVar2 <= (int)*(size_t *)(p_Var6 + 1)) {
            p_Var5 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < iVar2];
        } while (p_Var6 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var5 != p_Var1) &&
            ((int)((_Rb_tree_header *)p_Var5)->_M_node_count <= iVar2)) &&
           (plVar3 = *(long **)((long)p_Var5 + 0x28), plVar3 != (long *)0x0)) {
          cVar4 = (**(code **)(*plVar3 + 0x68))(plVar3,internal);
          if (cVar4 != '\0') {
            bVar7 = true;
            goto LAB_0015ff70;
          }
        }
      }
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
  }
  bVar7 = false;
LAB_0015ff70:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::CanGetAddresses(bool internal) const
{
    LOCK(cs_wallet);
    if (m_spk_managers.empty()) return false;
    for (OutputType t : OUTPUT_TYPES) {
        auto spk_man = GetScriptPubKeyMan(t, internal);
        if (spk_man && spk_man->CanGetAddresses(internal)) {
            return true;
        }
    }
    return false;
}